

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kosinski-compress.c
# Opt level: O0

void FlushData(KosinskiCompressCallbacks *callbacks)

{
  ulong local_18;
  size_t i;
  KosinskiCompressCallbacks *callbacks_local;
  
  descriptor = descriptor >> ((byte)descriptor_bits_remaining & 0x1f);
  for (local_18 = 0; local_18 < 2; local_18 = local_18 + 1) {
    (*callbacks->write_byte)
              (callbacks->write_byte_user_data,descriptor >> ((byte)(local_18 << 3) & 0x1f) & 0xff);
  }
  for (local_18 = 0; local_18 < match_buffer_index; local_18 = local_18 + 1) {
    (*callbacks->write_byte)(callbacks->write_byte_user_data,(uint)match_buffer[local_18]);
  }
  output_position = match_buffer_index + 2 + output_position;
  return;
}

Assistant:

static void FlushData(const KosinskiCompressCallbacks* const callbacks)
{
	size_t i;

	descriptor >>= descriptor_bits_remaining;

	/* Descriptors are stored byte-swapped, so it's possible that the original
	   compressor was designed for a little-endian CPU and that it did this:
	   fwrite(&descriptor, 2, 1, output_file); */
	for (i = 0; i < TOTAL_DESCRIPTOR_BITS / 8; ++i)
		callbacks->write_byte((void*)callbacks->write_byte_user_data, (descriptor >> (i * 8)) & 0xFF);

	for (i = 0; i < match_buffer_index; ++i)
		callbacks->write_byte((void*)callbacks->write_byte_user_data, match_buffer[i]);

	output_position += TOTAL_DESCRIPTOR_BITS / 8 + match_buffer_index;
}